

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  IdList_item *pIVar1;
  sqlite3_vfs *psVar2;
  int *piVar3;
  char *pcVar4;
  IdList_item *pOldItem;
  IdList_item *pNewItem;
  int i;
  IdList *pNew;
  IdList *p_local;
  sqlite3 *db_local;
  
  if (p == (IdList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,0x10);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      *(int *)&db_local->pVdbe = p->nId;
      psVar2 = (sqlite3_vfs *)sqlite3DbMallocRawNN(db,(long)p->nId << 4);
      db_local->pVfs = psVar2;
      if (db_local->pVfs == (sqlite3_vfs *)0x0) {
        sqlite3DbFreeNN(db,db_local);
        db_local = (sqlite3 *)0x0;
      }
      else {
        for (pNewItem._4_4_ = 0; pNewItem._4_4_ < p->nId; pNewItem._4_4_ = pNewItem._4_4_ + 1) {
          piVar3 = &db_local->pVfs->iVersion + (long)pNewItem._4_4_ * 4;
          pIVar1 = p->a;
          pcVar4 = sqlite3DbStrDup(db,pIVar1[pNewItem._4_4_].zName);
          *(char **)piVar3 = pcVar4;
          piVar3[2] = pIVar1[pNewItem._4_4_].idx;
        }
      }
    }
  }
  return (IdList *)db_local;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  pNew->a = sqlite3DbMallocRawNN(db, p->nId*sizeof(p->a[0]) );
  if( pNew->a==0 ){
    sqlite3DbFreeNN(db, pNew);
    return 0;
  }
  /* Note that because the size of the allocation for p->a[] is not
  ** necessarily a power of two, sqlite3IdListAppend() may not be called
  ** on the duplicate created by this function. */
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->idx = pOldItem->idx;
  }
  return pNew;
}